

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsIteratorMutable(void)

{
  uint *puVar1;
  uint uVar2;
  reference puVar3;
  ostream *poVar4;
  int iVar5;
  size_t index;
  char *pcVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  initializer_list<unsigned_int> __l;
  allocator_type local_51;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  Span<unsigned_int,_18446744073709551615UL> span;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&values,__l,&local_51);
  puVar8 = (pointer)((long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  puVar9 = values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar8 == (pointer)0x0) {
    puVar9 = (pointer)0x0;
  }
  span.m_size.m_size = (long)puVar8 >> 2;
  index = 0;
  puVar7 = (pointer)0x0;
  span.m_ptr = puVar9;
  do {
    if (puVar8 == puVar7) {
      iVar5 = 0;
      if (index == 4) goto LAB_0017787c;
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x17a);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(counter) == (size_t(4))");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00177879;
    }
    uVar2 = *(uint *)((long)puVar9 + (long)puVar7);
    if (index + 1 != (ulong)uVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x175);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar6 = "(i) == (++counter)";
      goto LAB_0017785a;
    }
    *(uint *)((long)puVar9 + (long)puVar7) = uVar2 + 1;
    if (index + 2 != (ulong)(uVar2 + 1)) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x177);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar6 = "(i) == (counter + 1)";
      goto LAB_0017785a;
    }
    puVar3 = MILBlob::Util::Span<unsigned_int,_18446744073709551615UL>::operator[](&span,index);
    puVar1 = (uint *)((long)puVar9 + (long)puVar7);
    index = (ulong)uVar2;
    puVar7 = puVar7 + 1;
  } while (*puVar3 == *puVar1);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x178);
  poVar4 = std::operator<<(poVar4,": error: ");
  pcVar6 = "(span[counter - 1]) == (i)";
LAB_0017785a:
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00177879:
  iVar5 = 1;
LAB_0017787c:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return iVar5;
}

Assistant:

int testSpanTestsIteratorMutable()
{
    std::vector<uint32_t> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    size_t counter = 0;
    for (auto& i : span) {
        ML_ASSERT_EQ(i, ++counter);
        i++;
        ML_ASSERT_EQ(i, counter + 1);
        ML_ASSERT_EQ(span[counter - 1], i);
    }
    ML_ASSERT_EQ(counter, size_t(4));

    return 0;
}